

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

bool __thiscall ON_wString::IsValidIntegerNumber(ON_wString *this)

{
  uint uVar1;
  wchar_t __wc;
  wchar_t *pwVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ON_Internal_Empty_wString *pOVar7;
  bool bVar8;
  ulong uVar9;
  
  pwVar2 = this->m_s;
  pOVar7 = &empty_wstring;
  if (pwVar2 != (wchar_t *)0x0) {
    pOVar7 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
  }
  uVar1 = (pOVar7->header).string_length;
  if ((ulong)uVar1 == 0) {
LAB_00685605:
    bVar5 = false;
  }
  else {
    bVar5 = (int)uVar1 < 1;
    if (0 < (int)uVar1) {
      bVar8 = true;
      uVar9 = 0;
      bVar3 = false;
      bVar5 = false;
      do {
        __wc = pwVar2[uVar9];
        iVar6 = iswspace(__wc);
        if (iVar6 == 0) {
          iVar6 = iswdigit(__wc);
          if ((((iVar6 != 0) || (__wc == L'-')) || (bVar4 = true, __wc == L'+')) &&
             (bVar4 = bVar5, !bVar5)) {
            bVar8 = false;
          }
        }
        else {
          bVar5 = bVar3;
          if (!bVar8) {
            bVar5 = true;
          }
          bVar4 = false;
          bVar3 = bVar5;
        }
        if (bVar4) goto LAB_00685605;
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}